

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caxpy.c
# Opt level: O0

void caxpy_(integer *n,singlecomplex *ca,singlecomplex *cx,integer *incx,singlecomplex *cy,
           integer *incy)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float local_6c;
  float local_60;
  int local_5c;
  int local_58;
  integer iy;
  integer ix;
  integer i;
  singlecomplex q__2;
  singlecomplex q__1;
  real r__2;
  real r__1;
  integer *incy_local;
  singlecomplex *cy_local;
  integer *incx_local;
  singlecomplex *cx_local;
  singlecomplex *ca_local;
  integer *n_local;
  
  if (0 < *n) {
    local_60 = ca->r;
    if (local_60 < 0.0) {
      local_60 = -local_60;
    }
    dVar6 = r_imag(ca);
    local_6c = (float)dVar6;
    if (local_6c < 0.0) {
      local_6c = -local_6c;
    }
    if ((local_60 + local_6c != 0.0) || (NAN(local_60 + local_6c))) {
      if ((*incx == 1) && (*incy == 1)) {
        for (iy = 1; iy <= *n; iy = iy + 1) {
          fVar1 = ca->r;
          fVar2 = cx[iy + -1].i;
          fVar3 = ca->i;
          fVar4 = cx[iy + -1].r;
          fVar5 = cy[iy + -1].i;
          cy[iy + -1].r = cy[iy + -1].r + ca->r * cx[iy + -1].r + -(ca->i * cx[iy + -1].i);
          cy[iy + -1].i = fVar5 + fVar1 * fVar2 + fVar3 * fVar4;
        }
      }
      else {
        local_58 = 1;
        local_5c = 1;
        if (*incx < 0) {
          local_58 = (1 - *n) * *incx + 1;
        }
        if (*incy < 0) {
          local_5c = (1 - *n) * *incy + 1;
        }
        for (iy = 1; iy <= *n; iy = iy + 1) {
          fVar1 = ca->r;
          fVar2 = cx[local_58 + -1].i;
          fVar3 = ca->i;
          fVar4 = cx[local_58 + -1].r;
          fVar5 = cy[local_5c + -1].i;
          cy[local_5c + -1].r =
               cy[local_5c + -1].r + ca->r * cx[local_58 + -1].r + -(ca->i * cx[local_58 + -1].i);
          cy[local_5c + -1].i = fVar5 + fVar1 * fVar2 + fVar3 * fVar4;
          local_58 = *incx + local_58;
          local_5c = *incy + local_5c;
        }
      }
    }
  }
  return;
}

Assistant:

void caxpy_(integer *n, singlecomplex *ca, singlecomplex *cx, integer *
	incx, singlecomplex *cy, integer *incy)
{


    /* System generated locals */

    real r__1, r__2;
    singlecomplex q__1, q__2;

    /* Builtin functions */
    double r_imag(singlecomplex *);

    /* Local variables */
    integer i, ix, iy;


/*     constant times a vector plus a vector.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define CY(I) cy[(I)-1]
#define CX(I) cx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if ((r__1 = ca->r, dabs(r__1)) + (r__2 = r_imag(ca), dabs(r__2)) == 0.f) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	q__2.r = ca->r * CX(ix).r - ca->i * CX(ix).i, q__2.i = ca->r * CX(
		ix).i + ca->i * CX(ix).r;
	q__1.r = CY(iy).r + q__2.r, q__1.i = CY(iy).i + q__2.i;
	CY(iy).r = q__1.r, CY(iy).i = q__1.i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	q__2.r = ca->r * CX(i).r - ca->i * CX(i).i, q__2.i = ca->r * CX(
		i).i + ca->i * CX(i).r;
	q__1.r = CY(i).r + q__2.r, q__1.i = CY(i).i + q__2.i;
	CY(i).r = q__1.r, CY(i).i = q__1.i;
/* L30: */
    }
    return;
}